

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

void updateNormalHints(_GLFWwindow *window,int width,int height)

{
  byte *pbVar1;
  int iVar2;
  XSizeHints *pXVar3;
  long lVar4;
  long lVar5;
  
  pXVar3 = (*_glfw.x11.xlib.AllocSizeHints)();
  if (window->monitor == (_GLFWmonitor *)0x0) {
    if (window->resizable == 0) {
      *(byte *)&pXVar3->flags = (byte)pXVar3->flags | 0x30;
      pXVar3->max_width = width;
      pXVar3->min_width = width;
      lVar4 = 0x1c;
      lVar5 = 0x24;
    }
    else {
      if ((window->minwidth != -1) && (window->minheight != -1)) {
        *(byte *)&pXVar3->flags = (byte)pXVar3->flags | 0x10;
        pXVar3->min_width = window->minwidth;
        pXVar3->min_height = window->minheight;
      }
      if ((window->maxwidth != -1) && (window->maxheight != -1)) {
        *(byte *)&pXVar3->flags = (byte)pXVar3->flags | 0x20;
        pXVar3->max_width = window->maxwidth;
        pXVar3->max_height = window->maxheight;
      }
      if ((window->numer == -1) || (window->denom == -1)) goto LAB_0015921b;
      *(byte *)&pXVar3->flags = (byte)pXVar3->flags | 0x80;
      iVar2 = window->numer;
      (pXVar3->max_aspect).x = iVar2;
      (pXVar3->min_aspect).x = iVar2;
      height = window->denom;
      lVar4 = 0x34;
      lVar5 = 0x3c;
    }
    *(int *)((long)&pXVar3->flags + lVar5) = height;
    *(int *)((long)&pXVar3->flags + lVar4) = height;
  }
LAB_0015921b:
  pbVar1 = (byte *)((long)&pXVar3->flags + 1);
  *pbVar1 = *pbVar1 | 2;
  pXVar3->win_gravity = 10;
  (*_glfw.x11.xlib.SetWMNormalHints)(_glfw.x11.display,(window->x11).handle,pXVar3);
  (*_glfw.x11.xlib.Free)(pXVar3);
  return;
}

Assistant:

static void updateNormalHints(_GLFWwindow* window, int width, int height)
{
    XSizeHints* hints = XAllocSizeHints();

    if (!window->monitor)
    {
        if (window->resizable)
        {
            if (window->minwidth != GLFW_DONT_CARE &&
                window->minheight != GLFW_DONT_CARE)
            {
                hints->flags |= PMinSize;
                hints->min_width = window->minwidth;
                hints->min_height = window->minheight;
            }

            if (window->maxwidth != GLFW_DONT_CARE &&
                window->maxheight != GLFW_DONT_CARE)
            {
                hints->flags |= PMaxSize;
                hints->max_width = window->maxwidth;
                hints->max_height = window->maxheight;
            }

            if (window->numer != GLFW_DONT_CARE &&
                window->denom != GLFW_DONT_CARE)
            {
                hints->flags |= PAspect;
                hints->min_aspect.x = hints->max_aspect.x = window->numer;
                hints->min_aspect.y = hints->max_aspect.y = window->denom;
            }
        }
        else
        {
            hints->flags |= (PMinSize | PMaxSize);
            hints->min_width  = hints->max_width  = width;
            hints->min_height = hints->max_height = height;
        }
    }

    hints->flags |= PWinGravity;
    hints->win_gravity = StaticGravity;

    XSetWMNormalHints(_glfw.x11.display, window->x11.handle, hints);
    XFree(hints);
}